

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalOrder::Sink
          (PhysicalOrder *this,ExecutionContext *context,DataChunk *chunk,OperatorSinkInput *input)

{
  StateWithBlockableTasks *global_sort_state;
  LocalSortState *this_00;
  DataChunk *this_01;
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  BufferManager *buffer_manager_p;
  _func_int **pp_Var3;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  global_sort_state = &pGVar1[1].super_StateWithBlockableTasks;
  this_00 = (LocalSortState *)(pLVar2 + 1);
  if (*(char *)&pLVar2[1]._vptr_LocalSinkState == '\0') {
    buffer_manager_p = BufferManager::GetBufferManager(context->client);
    LocalSortState::Initialize(this_00,(GlobalSortState *)global_sort_state,buffer_manager_p);
  }
  this_01 = (DataChunk *)
            &pLVar2[6].partition_info.partition_data.
             super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             .
             super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  DataChunk::Reset(this_01);
  ExpressionExecutor::Execute
            ((ExpressionExecutor *)&pLVar2[5].partition_info.min_batch_index,chunk,this_01);
  DataChunk::ReferenceColumns((DataChunk *)&pLVar2[8].partition_info,chunk,&this->projections);
  DataChunk::Verify(this_01);
  DataChunk::Verify(chunk);
  LocalSortState::SinkChunk(this_00,this_01,(DataChunk *)&pLVar2[8].partition_info);
  pp_Var3 = (_func_int **)LocalSortState::SizeInBytes(this_00);
  if (pGVar1[9]._vptr_GlobalSinkState <= pp_Var3) {
    LocalSortState::Sort(this_00,(GlobalSortState *)global_sort_state,true);
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalOrder::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<OrderGlobalSinkState>();
	auto &lstate = input.local_state.Cast<OrderLocalSinkState>();

	auto &global_sort_state = gstate.global_sort_state;
	auto &local_sort_state = lstate.local_sort_state;

	// Initialize local state (if necessary)
	if (!local_sort_state.initialized) {
		local_sort_state.Initialize(global_sort_state, BufferManager::GetBufferManager(context.client));
	}

	// Obtain sorting columns
	auto &keys = lstate.keys;
	keys.Reset();
	lstate.key_executor.Execute(chunk, keys);

	auto &payload = lstate.payload;
	payload.ReferenceColumns(chunk, projections);

	// Sink the data into the local sort state
	keys.Verify();
	chunk.Verify();
	local_sort_state.SinkChunk(keys, payload);

	// When sorting data reaches a certain size, we sort it
	if (local_sort_state.SizeInBytes() >= gstate.memory_per_thread) {
		local_sort_state.Sort(global_sort_state, true);
	}
	return SinkResultType::NEED_MORE_INPUT;
}